

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::checkCutoffGroups(MoleculeStamp *this)

{
  pointer ppCVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  ostream *poVar3;
  OpenMDException *this_00;
  ulong uVar4;
  pointer ppAVar5;
  _Iter_equals_val<const_int> __pred;
  vector<int,_std::allocator<int>_> cutoffGroupAtoms;
  string local_1d8;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  for (ppAVar5 = (this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppAVar5 !=
      (this->atomStamps_).
      super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar5 = ppAVar5 + 1) {
    _oss = (*ppAVar5)->index_;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->freeAtoms_,(int *)&oss);
  }
  uVar4 = 0;
  while( true ) {
    ppCVar1 = (this->cutoffGroupStamps_).
              super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->cutoffGroupStamps_).
                      super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar4) {
      return;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &cutoffGroupAtoms.super__Vector_base<int,_std::allocator<int>_>,
               &ppCVar1[(int)uVar4]->members_);
    local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
         (((long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    _Var2 = std::
            find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       cutoffGroupAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       cutoffGroupAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1b8);
    __pred._M_value =
         cutoffGroupAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (_Var2._M_current !=
        cutoffGroupAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    for (; __pred._M_value != _Var2._M_current; __pred._M_value = __pred._M_value + 1) {
      _Var2 = std::
              __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,__pred);
      std::vector<int,_std::allocator<int>_>::erase
                (&this->freeAtoms_,(const_iterator)_Var2._M_current,
                 (const_iterator)
                 (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      _Var2._M_current =
           cutoffGroupAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&cutoffGroupAtoms.super__Vector_base<int,_std::allocator<int>_>);
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Error in Molecule ");
  std::__cxx11::string::string((string *)&local_1d8,(string *)&(this->Name).data_);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,": cutoffGroup");
  std::operator<<(poVar3," is out of range\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1d8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkCutoffGroups() {
    std::vector<AtomStamp*>::iterator ai;
    std::vector<int>::iterator fai;

    // add all atoms into freeAtoms_ set
    for (ai = atomStamps_.begin(); ai != atomStamps_.end(); ++ai) {
      freeAtoms_.push_back((*ai)->getIndex());
    }

    for (std::size_t i = 0; i < getNCutoffGroups(); ++i) {
      CutoffGroupStamp* cutoffGroupStamp = getCutoffGroupStamp(i);
      std::vector<int> cutoffGroupAtoms  = cutoffGroupStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(cutoffGroupAtoms.begin(), cutoffGroupAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      if (j != cutoffGroupAtoms.end()) {
        std::ostringstream oss;
        oss << "Error in Molecule " << getName() << ": cutoffGroup"
            << " is out of range\n";
        throw OpenMDException(oss.str());
      }

      for (fai = cutoffGroupAtoms.begin(); fai != cutoffGroupAtoms.end();
           ++fai) {
        // erase the atoms belonging to cutoff groups from freeAtoms_ vector
        freeAtoms_.erase(
            std::remove(freeAtoms_.begin(), freeAtoms_.end(), (*fai)),
            freeAtoms_.end());
      }
    }
  }